

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamStandardIndex::WriteAlignmentChunk
          (BamStandardIndex *this,BaiAlignmentChunk *chunk)

{
  long lVar1;
  undefined8 uVar2;
  uint64_t *in_RSI;
  long in_RDI;
  int64_t numBytesWritten;
  uint64_t stop;
  uint64_t start;
  allocator local_81;
  string local_80 [16];
  string *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  BamException *in_stack_ffffffffffffffa0;
  allocator local_49;
  string local_48 [32];
  long local_28;
  uint64_t local_20;
  uint64_t local_18 [3];
  
  local_18[0] = *in_RSI;
  local_20 = in_RSI[1];
  if ((*(byte *)(in_RDI + 0x30) & 1) != 0) {
    SwapEndian_64(local_18);
    SwapEndian_64(&local_20);
  }
  local_28 = 0;
  lVar1 = (**(code **)(**(long **)(in_RDI + 0x58) + 0x40))(*(long **)(in_RDI + 0x58),local_18,8);
  local_28 = lVar1 + local_28;
  lVar1 = (**(code **)(**(long **)(in_RDI + 0x58) + 0x40))(*(long **)(in_RDI + 0x58),&local_20,8);
  local_28 = lVar1 + local_28;
  if (local_28 != 0x10) {
    uVar2 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"BamStandardIndex::WriteAlignmentChunk",&local_49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"could not write BAI alignment chunk",&local_81);
    BamException::BamException
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    __cxa_throw(uVar2,&BamException::typeinfo,BamException::~BamException);
  }
  return;
}

Assistant:

void BamStandardIndex::WriteAlignmentChunk(const BaiAlignmentChunk& chunk)
{

    // localize alignment chunk offsets
    uint64_t start = chunk.Start;
    uint64_t stop = chunk.Stop;

    // swap endian-ness if necessary
    if (m_isBigEndian) {
        SwapEndian_64(start);
        SwapEndian_64(stop);
    }

    // write to index file
    int64_t numBytesWritten = 0;
    numBytesWritten += m_resources.Device->Write((const char*)&start, sizeof(start));
    numBytesWritten += m_resources.Device->Write((const char*)&stop, sizeof(stop));
    if (numBytesWritten != (sizeof(start) + sizeof(stop)))
        throw BamException("BamStandardIndex::WriteAlignmentChunk",
                           "could not write BAI alignment chunk");
}